

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_staj_event<char>::as_bool(basic_staj_event<char> *this,error_code *ec)

{
  switch(this->event_type_) {
  case bool_value:
    return (this->value_).bool_value_;
  case int64_value:
  case uint64_value:
    return (this->value_).int64_value_ != 0;
  default:
    std::error_code::operator=(ec,not_bool);
    return false;
  case double_value:
    return (bool)(-((this->value_).double_value_ != 0.0) & 1);
  }
}

Assistant:

bool as_bool(std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::bool_value:
                return value_.bool_value_;
            case staj_event_type::double_value:
                return value_.double_value_ != 0.0;
            case staj_event_type::int64_value:
                return value_.int64_value_ != 0;
            case staj_event_type::uint64_value:
                return value_.uint64_value_ != 0;
            default:
                ec = conv_errc::not_bool;
                return bool();
        }
    }